

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

String __thiscall testing::internal::WideStringToUtf8(internal *this,wchar_t *str,int num_chars)

{
  undefined8 uVar1;
  size_t sVar2;
  size_t extraout_RDX;
  ulong uVar3;
  ulong uVar4;
  String SVar5;
  stringstream local_1e0 [8];
  stringstream stream;
  ostream local_1d0 [376];
  char local_58 [8];
  char buffer [32];
  
  buffer._24_8_ = this;
  if (num_chars == -1) {
    sVar2 = wcslen(str);
    num_chars = (int)sVar2;
  }
  std::__cxx11::stringstream::stringstream(local_1e0);
  uVar3 = 0;
  uVar4 = (ulong)(uint)num_chars;
  if (num_chars < 1) {
    uVar4 = uVar3;
  }
  for (; (uVar1 = buffer._24_8_, uVar4 != uVar3 && (str[uVar3] != L'\0')); uVar3 = uVar3 + 1) {
    CodePointToUtf8(str[uVar3],local_58);
    std::operator<<(local_1d0,local_58);
  }
  StringStreamToString((internal *)buffer._24_8_,(stringstream *)local_1e0);
  std::__cxx11::stringstream::~stringstream(local_1e0);
  SVar5.length_ = extraout_RDX;
  SVar5.c_str_ = (char *)uVar1;
  return SVar5;
}

Assistant:

String WideStringToUtf8(const wchar_t* str, int num_chars) {
  if (num_chars == -1)
    num_chars = static_cast<int>(wcslen(str));

  ::std::stringstream stream;
  for (int i = 0; i < num_chars; ++i) {
    UInt32 unicode_code_point;

    if (str[i] == L'\0') {
      break;
    } else if (i + 1 < num_chars && IsUtf16SurrogatePair(str[i], str[i + 1])) {
      unicode_code_point = CreateCodePointFromUtf16SurrogatePair(str[i],
                                                                 str[i + 1]);
      i++;
    } else {
      unicode_code_point = static_cast<UInt32>(str[i]);
    }

    char buffer[32];  // CodePointToUtf8 requires a buffer this big.
    stream << CodePointToUtf8(unicode_code_point, buffer);
  }
  return StringStreamToString(&stream);
}